

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

FunctionLookupChain *
anon_unknown.dwarf_94284::LookupFunctionChainByName
          (FunctionLookupChain *__return_storage_ptr__,ExpressionContext *ctx,uint nameHash)

{
  ScopeData *pSVar1;
  NodeIterator NVar2;
  
  pSVar1 = (ScopeData *)&ctx->scope;
  do {
    pSVar1 = pSVar1->scope;
    if (pSVar1 == (ScopeData *)0x0) goto LAB_001494b9;
    NVar2 = DirectChainedMap<IdentifierLookupResult>::first(&pSVar1->idLookupMap,nameHash);
  } while (NVar2.node == (Node *)0x0);
  if (*(long *)(NVar2.node + 0x10) == 0) {
LAB_001494b9:
    (__return_storage_ptr__->node).start = (Node *)0x0;
    (__return_storage_ptr__->node).node = (Node *)0x0;
    __return_storage_ptr__->scope = (ScopeData *)0x0;
  }
  else {
    (__return_storage_ptr__->node).start = NVar2.start;
    (__return_storage_ptr__->node).node = NVar2.node;
    __return_storage_ptr__->scope = pSVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

FunctionLookupChain LookupFunctionChainByName(ExpressionContext &ctx, unsigned nameHash)
	{
		typedef DirectChainedMap<IdentifierLookupResult>::NodeIterator Node;

		ScopeData *scope = ctx.scope;

		while(scope)
		{
			if(Node curr = scope->idLookupMap.first(nameHash))
			{
				if(curr.node->value.function)
					return FunctionLookupChain(curr, scope);

				return FunctionLookupChain();
			}

			scope = scope->scope;
		}

		return FunctionLookupChain();
	}